

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O0

void __thiscall MeCab::CharProperty::~CharProperty(CharProperty *this)

{
  void *in_RDI;
  CharProperty *unaff_retaddr;
  
  ~CharProperty(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~CharProperty() { this->close(); }